

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void __thiscall
duckdb::BitpackingScanState<int,_int>::Skip
          (BitpackingScanState<int,_int> *this,ColumnSegment *segment,idx_t skip_count)

{
  int *data;
  byte bVar1;
  int iVar2;
  idx_t i;
  size_t sVar3;
  ulong uVar4;
  ulong size;
  idx_t iVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar5 = this->current_group_offset;
  uVar4 = iVar5 + skip_count;
  if (uVar4 < 0x800) {
    uVar4 = 0;
  }
  else {
    uVar4 = uVar4 >> 0xb;
    this->bitpacking_metadata_ptr = this->bitpacking_metadata_ptr + -(uVar4 * 4 + -4);
    LoadNextGroup(this);
    uVar4 = ((uVar4 - 1) * 0x800 - iVar5) + 0x800;
  }
  uVar7 = skip_count - uVar4;
  uVar6 = (uint)(this->current_group).mode;
  if ((uVar6 < 6) && ((0x2cU >> (uVar6 & 0x1f) & 1) != 0)) {
    this->current_group_offset = this->current_group_offset + uVar7;
  }
  else if (uVar4 < skip_count) {
    iVar5 = this->current_group_offset;
    do {
      uVar6 = (uint)iVar5 & 0x1f;
      bVar1 = this->current_width;
      size = 0x20 - (ulong)uVar6;
      if (uVar7 < 0x20 - (ulong)uVar6) {
        size = uVar7;
      }
      duckdb_fastpforlib::fastunpack
                ((uint32_t *)
                 (this->current_group_ptr + ((bVar1 * iVar5 >> 3) - (ulong)(uVar6 * bVar1 >> 3))),
                 (uint32_t *)this->decompression_buffer,(uint)bVar1);
      data = this->decompression_buffer + uVar6;
      iVar2 = this->current_frame_of_reference;
      if (uVar7 != 0 && iVar2 != 0) {
        sVar3 = 0;
        do {
          data[sVar3] = data[sVar3] + iVar2;
          sVar3 = sVar3 + 1;
        } while (size != sVar3);
      }
      DeltaDecode<int>(data,this->current_delta_offset,size);
      this->current_delta_offset = data[size - 1];
      uVar4 = uVar4 + size;
      uVar7 = uVar7 - size;
      iVar5 = size + this->current_group_offset;
      this->current_group_offset = iVar5;
    } while (uVar4 < skip_count);
  }
  return;
}

Assistant:

void Skip(ColumnSegment &segment, idx_t skip_count) {
		bool skip_sign_extend = true;

		idx_t skipped = 0;
		idx_t initial_group_offset = current_group_offset;

		// This skips straight to the correct metadata group
		idx_t meta_groups_to_skip = (skip_count + current_group_offset) / BITPACKING_METADATA_GROUP_SIZE;
		if (meta_groups_to_skip) {

			// bitpacking_metadata_ptr points to the next metadata: this means we need to advance the pointer by n-1
			bitpacking_metadata_ptr -= (meta_groups_to_skip - 1) * sizeof(bitpacking_metadata_encoded_t);
			LoadNextGroup();
			// The first (partial) group we skipped
			skipped += BITPACKING_METADATA_GROUP_SIZE - initial_group_offset;
			// The remaining groups that were skipped
			skipped += (meta_groups_to_skip - 1) * BITPACKING_METADATA_GROUP_SIZE;
		}

		// Assert we can are in the correct metadata group
		idx_t remaining_to_skip = skip_count - skipped;
		D_ASSERT(current_group_offset + remaining_to_skip < BITPACKING_METADATA_GROUP_SIZE);

		if (current_group.mode == BitpackingMode::CONSTANT || current_group.mode == BitpackingMode::CONSTANT_DELTA ||
		    current_group.mode == BitpackingMode::FOR) {
			// Skipping within a constant or constant delta is done by increasing the current_group_offset
			skipped += remaining_to_skip;
			current_group_offset += remaining_to_skip;
		} else {
			// For DELTA we actually need to decompress from the current_group_offset up until the row we want to skip
			// to this is because we need that delta to be able to continue scanning from here
			D_ASSERT(current_group.mode == BitpackingMode::DELTA_FOR);

			while (skipped < skip_count) {
				// Calculate compression group offset and pointer
				idx_t offset_in_compression_group =
				    current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
				data_ptr_t current_position_ptr = current_group_ptr + current_group_offset * current_width / 8;
				data_ptr_t decompression_group_start_pointer =
				    current_position_ptr - offset_in_compression_group * current_width / 8;

				idx_t skipping_this_algorithm_group =
				    MinValue(remaining_to_skip,
				             BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - offset_in_compression_group);

				BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(decompression_buffer),
				                                     decompression_group_start_pointer, current_width,
				                                     skip_sign_extend);

				T *decompression_ptr = decompression_buffer + offset_in_compression_group;
				ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(decompression_ptr),
				                           static_cast<T_S>(current_frame_of_reference), skipping_this_algorithm_group);
				DeltaDecode<T_S>(reinterpret_cast<T_S *>(decompression_ptr), static_cast<T_S>(current_delta_offset),
				                 skipping_this_algorithm_group);
				current_delta_offset = decompression_ptr[skipping_this_algorithm_group - 1];

				skipped += skipping_this_algorithm_group;
				current_group_offset += skipping_this_algorithm_group;
				remaining_to_skip -= skipping_this_algorithm_group;
			}
		}

		D_ASSERT(skipped == skip_count);
	}